

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

Var Js::JavascriptConversion::ToPropertyKey
              (Var argument,ScriptContext *scriptContext,PropertyRecord **propertyRecord,
              PropertyString **propString)

{
  bool bVar1;
  JavascriptString *obj;
  JavascriptSymbol *pJVar2;
  PropertyString *pPVar3;
  
  obj = (JavascriptString *)ToPrimitive<(Js::JavascriptHint)1>(argument,scriptContext);
  bVar1 = VarIs<Js::JavascriptSymbol>(obj);
  if (bVar1) {
    pJVar2 = UnsafeVarTo<Js::JavascriptSymbol>(obj);
    *propertyRecord = (pJVar2->propertyRecordUsageCache).propertyRecord.ptr;
    pPVar3 = (PropertyString *)0x0;
  }
  else {
    obj = ToString(obj,scriptContext);
    pPVar3 = (PropertyString *)0x0;
    (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x61])(obj,propertyRecord,0);
    bVar1 = VarIsImpl<Js::PropertyString>(&obj->super_RecyclableObject);
    if (bVar1) {
      pPVar3 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(obj);
    }
  }
  if (propString != (PropertyString **)0x0) {
    *propString = pPVar3;
  }
  return obj;
}

Assistant:

Var JavascriptConversion::ToPropertyKey(
        Var argument,
        _In_ ScriptContext* scriptContext,
        _Out_ const PropertyRecord** propertyRecord,
        _Out_opt_ PropertyString** propString)
    {
        Var key = JavascriptConversion::ToPrimitive<JavascriptHint::HintString>(argument, scriptContext);
        PropertyString * propertyString = nullptr;
        if (VarIs<JavascriptSymbol>(key))
        {
            // If we are looking up a property keyed by a symbol, we already have the PropertyId in the symbol
            *propertyRecord = UnsafeVarTo<JavascriptSymbol>(key)->GetValue();
        }
        else
        {
            // For all other types, convert the key into a string and use that as the property name
            JavascriptString * propName = JavascriptConversion::ToString(key, scriptContext);
            propName->GetPropertyRecord(propertyRecord);
            if (VarIs<PropertyString>(propName))
            {
                propertyString = UnsafeVarTo<PropertyString>(propName);
            }
            key = propName;
        }

        if (propString)
        {
            *propString = propertyString;
        }

        return key;
    }